

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase196::run(TestCase196 *this)

{
  anon_union_64_2_42f82436 *paVar1;
  anon_union_64_2_42f82436 *paVar2;
  ArrayPtr<unsigned_char> AVar3;
  anon_union_64_2_42f82436 *local_90;
  anon_union_64_2_42f82436 *local_88;
  Arena arena;
  anon_union_64_2_42f82436 anon_var_0;
  
  AVar3.size_ = 0x40;
  AVar3.ptr = (uchar *)&anon_var_0;
  Arena::Arena(&arena,AVar3);
  paVar1 = (anon_union_64_2_42f82436 *)Arena::allocate<unsigned_long>(&arena);
  if (paVar1 < &anon_var_0 && _::Debug::minSeverity < 3) {
    local_90 = paVar1;
    _::Debug::log<char_const(&)[60],unsigned_char*,unsigned_char(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) >= (scratch)\", reinterpret_cast<byte*>(&i), scratch"
               ,(char (*) [60])"failed: expected (reinterpret_cast<byte*>(&i)) >= (scratch)",
               (uchar **)&local_90,(uchar (*) [64])&anon_var_0);
  }
  if (((anon_union_64_2_42f82436 *)&stack0xffffffffffffffe0 <= paVar1) &&
     (_::Debug::minSeverity < 3)) {
    local_90 = paVar1;
    local_88 = (anon_union_64_2_42f82436 *)&stack0xffffffffffffffe0;
    _::Debug::log<char_const(&)[77],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))\", reinterpret_cast<byte*>(&i), scratch + sizeof(scratch)"
               ,(char (*) [77])
                "failed: expected (reinterpret_cast<byte*>(&i)) < (scratch + sizeof(scratch))",
               (uchar **)&local_90,(uchar **)&local_88);
  }
  paVar2 = (anon_union_64_2_42f82436 *)Arena::allocate<unsigned_long>(&arena);
  if (((anon_union_64_2_42f82436 *)(paVar1->scratch + 8) != paVar2) && (_::Debug::minSeverity < 3))
  {
    local_90 = (anon_union_64_2_42f82436 *)(paVar1->scratch + 8);
    local_88 = paVar2;
    _::Debug::log<char_const(&)[35],unsigned_long*,unsigned_long*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xd2,ERROR,"\"failed: expected \" \"(&i + 1) == (&i2)\", &i + 1, &i2",
               (char (*) [35])"failed: expected (&i + 1) == (&i2)",(unsigned_long **)&local_90,
               (unsigned_long **)&local_88);
  }
  paVar2 = (anon_union_64_2_42f82436 *)(paVar2->scratch + 8);
  AVar3 = Arena::allocateArray<unsigned_char>(&arena,(long)&stack0xffffffffffffffe0 - (long)paVar2);
  paVar1 = (anon_union_64_2_42f82436 *)AVar3.ptr;
  if ((paVar2 != paVar1) && (_::Debug::minSeverity < 3)) {
    local_90 = paVar2;
    local_88 = paVar1;
    _::Debug::log<char_const(&)[75],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xd7,ERROR,
               "\"failed: expected \" \"(reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())\", reinterpret_cast<byte*>(&i2 + 1), remaining.begin()"
               ,(char (*) [75])
                "failed: expected (reinterpret_cast<byte*>(&i2 + 1)) == (remaining.begin())",
               (uchar **)&local_90,(uchar **)&local_88);
  }
  paVar2 = (anon_union_64_2_42f82436 *)Arena::allocate<unsigned_long>(&arena);
  if (((anon_union_64_2_42f82436 *)(paVar1->scratch + AVar3.size_) == paVar2) &&
     (_::Debug::minSeverity < 3)) {
    local_90 = (anon_union_64_2_42f82436 *)(paVar1->scratch + AVar3.size_);
    local_88 = paVar2;
    _::Debug::log<char_const(&)[69],unsigned_char*,unsigned_char*>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(remaining.end()) != (reinterpret_cast<byte*>(&i3))\", remaining.end(), reinterpret_cast<byte*>(&i3)"
               ,(char (*) [69])
                "failed: expected (remaining.end()) != (reinterpret_cast<byte*>(&i3))",
               (uchar **)&local_90,(uchar **)&local_88);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, EndOfChunk) {
  union {
    byte scratch[64];
    uint64_t align;
  };
  Arena arena(arrayPtr(scratch, sizeof(scratch)));

  // First allocation will come from somewhere in the scratch space (after the chunk header).
  uint64_t& i = arena.allocate<uint64_t>();
  EXPECT_GE(reinterpret_cast<byte*>(&i), scratch);
  EXPECT_LT(reinterpret_cast<byte*>(&i), scratch + sizeof(scratch));

  // Next allocation will come at the next position.
  uint64_t& i2 = arena.allocate<uint64_t>();
  EXPECT_EQ(&i + 1, &i2);

  // Allocate the rest of the scratch space.
  size_t spaceLeft = scratch + sizeof(scratch) - reinterpret_cast<byte*>(&i2 + 1);
  ArrayPtr<byte> remaining = arena.allocateArray<byte>(spaceLeft);
  EXPECT_EQ(reinterpret_cast<byte*>(&i2 + 1), remaining.begin());

  // Next allocation comes from somewhere new.
  uint64_t& i3 = arena.allocate<uint64_t>();
  EXPECT_NE(remaining.end(), reinterpret_cast<byte*>(&i3));
}